

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::BitmapImage::BitmapImage(BitmapImage *this,FILE *f,size_t width,size_t height)

{
  uint8_t *__s;
  ulong uVar1;
  
  this->width = width;
  this->height = height;
  uVar1 = width + 7 >> 3;
  this->row_bytes = uVar1;
  uVar1 = uVar1 * height;
  __s = (uint8_t *)operator_new__(uVar1);
  this->data = __s;
  memset(__s,0,uVar1);
  freadx(f,__s,uVar1);
  return;
}

Assistant:

BitmapImage::BitmapImage(FILE* f, size_t width, size_t height)
    : BitmapImage(width, height) {
  freadx(f, this->data, this->get_data_size());
}